

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void SwapUVRow_C(uint8_t *src_uv,uint8_t *dst_vu,int width)

{
  long lVar1;
  
  if (0 < width) {
    lVar1 = 0;
    do {
      *(ushort *)(dst_vu + lVar1 * 2) =
           *(ushort *)(src_uv + lVar1 * 2) << 8 | *(ushort *)(src_uv + lVar1 * 2) >> 8;
      lVar1 = lVar1 + 1;
    } while (width != (int)lVar1);
  }
  return;
}

Assistant:

void SwapUVRow_C(const uint8_t* src_uv, uint8_t* dst_vu, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t u = src_uv[0];
    uint8_t v = src_uv[1];
    dst_vu[0] = v;
    dst_vu[1] = u;
    src_uv += 2;
    dst_vu += 2;
  }
}